

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O2

void aom_highbd_hadamard_16x16_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  tran_low_t *coeff_00;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  uVar3 = 0;
  coeff_00 = coeff;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
    aom_highbd_hadamard_8x8_avx2
              (src_diff + (ulong)((uint)lVar4 & 8) * src_stride + (ulong)(uVar3 & 8),src_stride,
               coeff_00);
    coeff_00 = coeff_00 + 0x40;
    uVar3 = uVar3 + 8;
  }
  for (lVar4 = 0; (uint)lVar4 < 0x40; lVar4 = lVar4 + 8) {
    auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(coeff + lVar4 + 0x40),
                         *(undefined1 (*) [32])(coeff + lVar4));
    auVar6 = vpsubd_avx2(*(undefined1 (*) [32])(coeff + lVar4),
                         *(undefined1 (*) [32])(coeff + lVar4 + 0x40));
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(coeff + lVar4 + 0xc0),
                         *(undefined1 (*) [32])(coeff + lVar4 + 0x80));
    auVar7 = vpsubd_avx2(*(undefined1 (*) [32])(coeff + lVar4 + 0x80),
                         *(undefined1 (*) [32])(coeff + lVar4 + 0xc0));
    auVar8 = vpsrad_avx2(auVar1,1);
    auVar5 = vpsrad_avx2(auVar6,1);
    auVar6 = vpsrad_avx2(auVar2,1);
    auVar7 = vpsrad_avx2(auVar7,1);
    auVar1 = vpaddd_avx2(auVar6,auVar8);
    auVar2 = vpaddd_avx2(auVar7,auVar5);
    auVar6 = vpsubd_avx2(auVar8,auVar6);
    auVar7 = vpsubd_avx2(auVar5,auVar7);
    *(undefined1 (*) [32])(coeff + lVar4) = auVar1;
    *(undefined1 (*) [32])(coeff + lVar4 + 0x40) = auVar2;
    *(undefined1 (*) [32])(coeff + lVar4 + 0x80) = auVar6;
    *(undefined1 (*) [32])(coeff + lVar4 + 0xc0) = auVar7;
  }
  return;
}

Assistant:

void aom_highbd_hadamard_16x16_avx2(const int16_t *src_diff,
                                    ptrdiff_t src_stride, tran_low_t *coeff) {
  int idx;
  tran_low_t *t_coeff = coeff;
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_highbd_hadamard_8x8_avx2(src_ptr, src_stride, t_coeff + idx * 64);
  }

  for (idx = 0; idx < 64; idx += 8) {
    __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 64));
    __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 128));
    __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 192));

    __m256i b0 = _mm256_add_epi32(coeff0, coeff1);
    __m256i b1 = _mm256_sub_epi32(coeff0, coeff1);
    __m256i b2 = _mm256_add_epi32(coeff2, coeff3);
    __m256i b3 = _mm256_sub_epi32(coeff2, coeff3);

    b0 = _mm256_srai_epi32(b0, 1);
    b1 = _mm256_srai_epi32(b1, 1);
    b2 = _mm256_srai_epi32(b2, 1);
    b3 = _mm256_srai_epi32(b3, 1);

    coeff0 = _mm256_add_epi32(b0, b2);
    coeff1 = _mm256_add_epi32(b1, b3);
    coeff2 = _mm256_sub_epi32(b0, b2);
    coeff3 = _mm256_sub_epi32(b1, b3);

    _mm256_storeu_si256((__m256i *)coeff, coeff0);
    _mm256_storeu_si256((__m256i *)(coeff + 64), coeff1);
    _mm256_storeu_si256((__m256i *)(coeff + 128), coeff2);
    _mm256_storeu_si256((__m256i *)(coeff + 192), coeff3);

    coeff += 8;
    t_coeff += 8;
  }
}